

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

int __thiscall
baryonyx::itm::
solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
::select_variables(solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                   *this,rc_size *sizes,int bkmin,int bkmax)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  double dVar8;
  
  iVar2 = sizes->c_size;
  iVar4 = iVar2 + bkmin;
  if (bkmin == bkmax) {
    iVar3 = iVar4;
    if (sizes->r_size < iVar4) {
      iVar3 = sizes->r_size;
    }
  }
  else {
    iVar3 = bkmax + iVar2;
    if (sizes->r_size < bkmax + iVar2) {
      iVar3 = sizes->r_size;
    }
    if (iVar4 <= iVar3) {
      bVar6 = false;
      lVar5 = ((long)iVar2 + (long)bkmin) * 0xc;
      lVar7 = (long)iVar2 + (long)bkmin;
      do {
        fVar1 = *(float *)((long)&((this->R)._M_t.
                                   super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                                   .
                                   super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_false>
                                  ._M_head_impl)->value + lVar5);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          if (fVar1 < 0.0) goto LAB_00428fb9;
        }
        else {
          dVar8 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (this->rng);
          if (dVar8 < 0.5) {
LAB_00428fb9:
            if (!bVar6) {
              iVar3 = iVar4;
            }
            break;
          }
        }
        bVar6 = iVar3 <= lVar7;
        iVar4 = iVar4 + 1;
        lVar5 = lVar5 + 0xc;
        lVar7 = lVar7 + 1;
      } while (iVar3 + 1 != iVar4);
    }
  }
  return iVar3 + -1;
}

Assistant:

int select_variables(const rc_size& sizes, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin + sizes.c_size, sizes.r_size) - 1;

        bkmin += sizes.c_size;
        bkmax = std::min(bkmax + sizes.c_size, sizes.r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }